

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCommandBuffersTests.cpp
# Opt level: O3

TestStatus *
vkt::api::anon_unknown_0::submitBufferWaitManySemaphores
          (TestStatus *__return_storage_ptr__,Context *context)

{
  VkDevice *ppVVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  DeviceInterface *pDVar4;
  VkDevice pVVar5;
  VkAllocationCallbacks *pVVar6;
  bool bVar7;
  VkResult VVar8;
  int iVar9;
  VkDevice pVVar10;
  DeviceInterface *vk;
  Handle<(vk::HandleType)4> HVar11;
  deUint64 *pdVar12;
  bool bVar13;
  long lVar14;
  Handle<(vk::HandleType)4> HVar15;
  Deleter<vk::Handle<(vk::HandleType)4>_> *this;
  TestStatus *pTVar16;
  undefined1 auVar17 [16];
  VkSubmitInfo submitInfo2;
  VkCommandBufferBeginInfo primCmdBufBeginInfo;
  VkCommandPoolCreateInfo cmdPoolParams;
  Move<vk::Handle<(vk::HandleType)4>_> semaphoreArray [10];
  VkSemaphore semaphores [10];
  VkCommandBufferAllocateInfo cmdBufParams;
  Move<vk::Handle<(vk::HandleType)4>_> local_338;
  TestStatus *local_310;
  PFN_vkInternalAllocationNotification local_308;
  DeviceInterface *pDStack_300;
  VkDevice local_2f8;
  VkAllocationCallbacks *pVStack_2f0;
  VkQueue local_2e0;
  VkAllocationCallbacks *local_2d8;
  DeviceInterface *pDStack_2d0;
  undefined1 local_2c8 [16];
  VkDevice *local_2b8;
  undefined4 local_2b0;
  PFN_vkInternalAllocationNotification *local_2a8;
  undefined4 local_2a0;
  deUint64 *local_298;
  VkEvent local_288;
  Deleter<vk::Handle<(vk::HandleType)10>_> DStack_280;
  VkFence local_268;
  Deleter<vk::Handle<(vk::HandleType)6>_> DStack_260;
  VkCommandPool local_248;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_240;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  VkCommandPoolCreateInfo local_200;
  RefData<vk::Handle<(vk::HandleType)10>_> local_1e8 [9];
  deUint64 local_c8;
  Deleter<vk::Handle<(vk::HandleType)4>_> DStack_c0;
  deUint64 local_a8 [11];
  VkCommandBufferAllocateInfo local_50;
  
  local_310 = __return_storage_ptr__;
  pVVar10 = Context::getDevice(context);
  vk = Context::getDeviceInterface(context);
  local_2e0 = Context::getUniversalQueue(context);
  local_200.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  local_200.sType = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
  local_200.pNext = (void *)0x0;
  local_200.flags = 2;
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)local_1e8,vk,pVVar10,&local_200,
             (VkAllocationCallbacks *)0x0);
  DStack_240.m_device = local_1e8[0].deleter.m_device;
  DStack_240.m_allocator = local_1e8[0].deleter.m_allocator;
  local_248.m_internal = local_1e8[0].object.m_internal;
  DStack_240.m_deviceIface = local_1e8[0].deleter.m_deviceIface;
  local_50.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
  local_50.pNext = (void *)0x0;
  local_50.commandPool.m_internal = local_1e8[0].object.m_internal;
  local_50.level = VK_COMMAND_BUFFER_LEVEL_PRIMARY;
  local_50.commandBufferCount = 1;
  ::vk::allocateCommandBuffer((Move<vk::VkCommandBuffer_s_*> *)local_1e8,vk,pVVar10,&local_50);
  local_2f8 = local_1e8[0].deleter.m_device;
  pVStack_2f0 = local_1e8[0].deleter.m_allocator;
  local_308 = (PFN_vkInternalAllocationNotification)local_1e8[0].object.m_internal;
  pDStack_300 = local_1e8[0].deleter.m_deviceIface;
  local_218 = 0;
  uStack_210 = 0;
  local_228 = 0x2a;
  uStack_220 = 0;
  ::vk::createEvent((Move<vk::Handle<(vk::HandleType)10>_> *)local_1e8,vk,pVVar10,0,
                    (VkAllocationCallbacks *)0x0);
  DStack_280.m_device = local_1e8[0].deleter.m_device;
  DStack_280.m_allocator = local_1e8[0].deleter.m_allocator;
  local_288.m_internal = local_1e8[0].object.m_internal;
  DStack_280.m_deviceIface = local_1e8[0].deleter.m_deviceIface;
  VVar8 = (*vk->_vptr_DeviceInterface[0x1d])(vk,pVVar10,local_1e8[0].object.m_internal);
  ::vk::checkResult(VVar8,"vk.resetEvent(vkDevice, *event)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0xd6c);
  VVar8 = (*vk->_vptr_DeviceInterface[0x49])(vk,local_308,&local_228);
  ::vk::checkResult(VVar8,"vk.beginCommandBuffer(*primCmdBuf, &primCmdBufBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0xd6f);
  (*vk->_vptr_DeviceInterface[0x6a])(vk,local_308,local_288.m_internal,0x10000);
  VVar8 = (*vk->_vptr_DeviceInterface[0x4a])(vk,local_308);
  ::vk::checkResult(VVar8,"vk.endCommandBuffer(*primCmdBuf)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0xd77);
  ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)local_1e8,vk,pVVar10,0,
                    (VkAllocationCallbacks *)0x0);
  DStack_260.m_device = local_1e8[0].deleter.m_device;
  DStack_260.m_allocator = local_1e8[0].deleter.m_allocator;
  local_268.m_internal = local_1e8[0].object.m_internal;
  DStack_260.m_deviceIface = local_1e8[0].deleter.m_deviceIface;
  lVar14 = 0;
  memset(local_1e8,0,0x140);
  pdVar12 = &local_1e8[0].object.m_internal;
  do {
    this = (Deleter<vk::Handle<(vk::HandleType)4>_> *)(pdVar12 + 1);
    ::vk::createSemaphore(&local_338,vk,pVVar10,0,(VkAllocationCallbacks *)0x0);
    pVVar6 = local_338.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_allocator;
    pVVar5 = local_338.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_device;
    pDVar4 = local_338.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_deviceIface;
    HVar11.m_internal =
         local_338.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.m_internal;
    local_2c8._0_8_ =
         local_338.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_device;
    local_2c8._8_8_ =
         local_338.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_allocator;
    local_2d8 = (VkAllocationCallbacks *)
                local_338.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.m_internal;
    pDStack_2d0 = local_338.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.
                  m_deviceIface;
    local_338.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.m_internal = 0;
    local_338.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    local_338.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_device = (VkDevice)0x0;
    local_338.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    if (*pdVar12 == 0) {
      pdVar12[2] = (deUint64)pVVar5;
      pdVar12[3] = (deUint64)pVVar6;
      *pdVar12 = HVar11.m_internal;
      this->m_deviceIface = pDVar4;
    }
    else {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)4>_>::operator()
                (this,(VkSemaphore)*pdVar12);
      pdVar12[2] = local_2c8._0_8_;
      pdVar12[3] = local_2c8._8_8_;
      *pdVar12 = (deUint64)local_2d8;
      this->m_deviceIface = pDStack_2d0;
      if (local_338.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)4>_>::operator()
                  (&local_338.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter,
                   (VkSemaphore)
                   local_338.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.m_internal)
        ;
      }
    }
    local_a8[lVar14] = *pdVar12;
    lVar14 = lVar14 + 1;
    pdVar12 = pdVar12 + 4;
  } while (lVar14 != 10);
  local_2d8 = (VkAllocationCallbacks *)CONCAT44(local_2d8._4_4_,4);
  pDStack_2d0 = (DeviceInterface *)0x0;
  local_2c8._0_8_ = local_2c8._0_8_ & 0xffffffff00000000;
  stack0xfffffffffffffd40 = (undefined1  [16])0x0;
  local_2b0 = 1;
  local_2a8 = &local_308;
  local_2a0 = 10;
  pdVar12 = local_a8;
  local_298 = pdVar12;
  VVar8 = (*vk->_vptr_DeviceInterface[2])(vk,local_2e0,1,&local_2d8,local_268.m_internal);
  ::vk::checkResult(VVar8,"vk.queueSubmit(queue, 1u, &submitInfo1, *fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0xd96);
  VVar8 = (*vk->_vptr_DeviceInterface[0x16])(vk,pVVar10,1,&local_268,0,0xffffffffffffffff);
  ::vk::checkResult(VVar8,"vk.waitForFences(vkDevice, 1, &fence.get(), 0u, INFINITE_TIMEOUT)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0xd99);
  iVar9 = (*vk->_vptr_DeviceInterface[0x1b])(vk,pVVar10,local_288.m_internal);
  if (iVar9 == 3) {
    VVar8 = (*vk->_vptr_DeviceInterface[0x1d])(vk,pVVar10,local_288.m_internal);
    ::vk::checkResult(VVar8,"vk.resetEvent(vkDevice, *event)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                      ,0xda1);
    VVar8 = (*vk->_vptr_DeviceInterface[0x14])(vk,pVVar10,1,&local_268);
    ::vk::checkResult(VVar8,"vk.resetFences(vkDevice, 1u, &fence.get())",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                      ,0xda4);
    HVar11.m_internal = (deUint64)operator_new(0x14);
    auVar3 = _DAT_00ac4b80;
    auVar2 = _DAT_00ac4b30;
    lVar14 = 0;
    do {
      auVar17._8_4_ = (int)lVar14;
      auVar17._0_8_ = lVar14;
      auVar17._12_4_ = (int)((ulong)lVar14 >> 0x20);
      auVar17 = (auVar17 | auVar2) ^ auVar3;
      if (auVar17._4_4_ == -0x80000000 && auVar17._0_4_ < -0x7ffffffb) {
        *(undefined4 *)(HVar11.m_internal + lVar14 * 4) = 1;
        *(undefined4 *)(HVar11.m_internal + lVar14 * 4 + 4) = 1;
      }
      lVar14 = lVar14 + 2;
    } while (lVar14 != 6);
    bVar7 = true;
    do {
      bVar13 = bVar7;
      local_2d8 = (VkAllocationCallbacks *)CONCAT44(local_2d8._4_4_,4);
      pDStack_2d0 = (DeviceInterface *)0x0;
      local_2c8._0_4_ = 5;
      local_2b8 = (VkDevice *)HVar11.m_internal;
      local_2c8._8_8_ = pdVar12;
      local_2b0 = 1;
      local_2a8 = &local_308;
      local_2a0 = 0;
      local_298 = (deUint64 *)0x0;
      VVar8 = (*vk->_vptr_DeviceInterface[2])(vk,local_2e0,1,&local_2d8,local_268.m_internal);
      ::vk::checkResult(VVar8,"vk.queueSubmit(queue, 1u, &submitInfo2, *fence)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                        ,0xdbc);
      VVar8 = (*vk->_vptr_DeviceInterface[0x16])(vk,pVVar10,1,&local_268,0,1000000000);
      ::vk::checkResult(VVar8,"vk.waitForFences(vkDevice, 1, &fence.get(), 0u, 1000 * 1000 * 1000)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                        ,0xdbf);
      iVar9 = (*vk->_vptr_DeviceInterface[0x1b])(vk,pVVar10,local_288.m_internal);
      if (iVar9 != 3) {
        ppVVar1 = &local_338.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_device;
        local_338.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.m_internal =
             (deUint64)ppVVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_338,"Submit Buffer and Wait for Many Semaphores Test FAILED","")
        ;
        pTVar16 = local_310;
        local_310->m_code = QP_TEST_RESULT_FAIL;
        (local_310->m_description)._M_dataplus._M_p = (pointer)&(local_310->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_310->m_description,
                   local_338.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.m_internal,
                   (undefined1 *)
                   ((long)&(local_338.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.
                           m_deviceIface)->_vptr_DeviceInterface +
                   local_338.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.m_internal)
                  );
        pVVar10 = local_338.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_device;
        HVar15.m_internal =
             local_338.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.m_internal;
        if ((VkDevice *)
            local_338.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.m_internal !=
            ppVVar1) goto LAB_004571c3;
        goto LAB_004571cb;
      }
      VVar8 = (*vk->_vptr_DeviceInterface[0x14])(vk,pVVar10,1,&local_268);
      ::vk::checkResult(VVar8,"vk.resetFences(vkDevice, 1u, &fence.get())",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                        ,0xdc8);
      VVar8 = (*vk->_vptr_DeviceInterface[0x1d])(vk,pVVar10,local_288.m_internal);
      ::vk::checkResult(VVar8,"vk.resetEvent(vkDevice, *event)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                        ,0xdcb);
      pdVar12 = local_a8 + 5;
      bVar7 = false;
    } while (bVar13);
    local_2d8 = (VkAllocationCallbacks *)local_2c8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2d8,"Submit Buffer and Wait for Many Semaphores Test succeeded","");
    pTVar16 = local_310;
    local_310->m_code = QP_TEST_RESULT_PASS;
    (local_310->m_description)._M_dataplus._M_p = (pointer)&(local_310->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_310->m_description,local_2d8,
               (undefined1 *)((long)&local_2d8->pUserData + (long)pDStack_2d0));
    pVVar10 = (VkDevice)local_2c8._0_8_;
    HVar15.m_internal = (deUint64)local_2d8;
    if (local_2d8 != (VkAllocationCallbacks *)local_2c8) {
LAB_004571c3:
      operator_delete((void *)HVar15.m_internal,(ulong)(pVVar10 + 1));
    }
LAB_004571cb:
    pVVar10 = (VkDevice)0x14;
  }
  else {
    ppVVar1 = &local_338.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_device;
    local_338.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.m_internal =
         (deUint64)ppVVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_338,"Submit Buffer and Wait for Many Semaphores Test FAILED","");
    pTVar16 = local_310;
    local_310->m_code = QP_TEST_RESULT_FAIL;
    (local_310->m_description)._M_dataplus._M_p = (pointer)&(local_310->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_310->m_description,
               local_338.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.m_internal,
               (undefined1 *)
               ((long)&(local_338.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.
                       m_deviceIface)->_vptr_DeviceInterface +
               local_338.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.m_internal));
    if ((VkDevice *)local_338.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.m_internal
        == ppVVar1) goto LAB_004571d8;
    pVVar10 = local_338.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_device + 1;
    HVar11.m_internal =
         local_338.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.m_internal;
  }
  operator_delete((void *)HVar11.m_internal,(ulong)pVVar10);
LAB_004571d8:
  lVar14 = 0;
  do {
    if (*(deUint64 *)((long)&local_c8 + lVar14) != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)4>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)4>_> *)
                 ((long)&DStack_c0.m_deviceIface + lVar14),
                 (VkSemaphore)*(deUint64 *)((long)&local_c8 + lVar14));
    }
    *(undefined1 (*) [16])((long)local_a8 + lVar14 + -0x10) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])((long)&local_c8 + lVar14) = (undefined1  [16])0x0;
    lVar14 = lVar14 + -0x20;
  } while (lVar14 != -0x140);
  if (local_268.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()(&DStack_260,local_268);
  }
  if (local_288.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)10>_>::operator()(&DStack_280,local_288);
  }
  if (local_308 != (PFN_vkInternalAllocationNotification)0x0) {
    local_1e8[0].object.m_internal = (deUint64)local_308;
    (*pDStack_300->_vptr_DeviceInterface[0x48])(pDStack_300,local_2f8,pVStack_2f0,1);
  }
  if (local_248.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()(&DStack_240,local_248);
  }
  return pTVar16;
}

Assistant:

tcu::TestStatus submitBufferWaitManySemaphores(Context& context)
{
	// This test will create numSemaphores semaphores, and signal them in NUM_SEMAPHORES submits to queue
	// After that the numSubmissions queue submissions will wait for each semaphore

	const deUint32							numSemaphores			= 10u;  // it must be multiply of numSubmission
	const deUint32							numSubmissions			= 2u;
	const VkDevice							vkDevice				= context.getDevice();
	const DeviceInterface&					vk						= context.getDeviceInterface();
	const VkQueue							queue					= context.getUniversalQueue();
	const deUint32							queueFamilyIndex		= context.getUniversalQueueFamilyIndex();

	const VkCommandPoolCreateInfo			cmdPoolParams			=
	{
		VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO,					// VkStructureType				sType;
		DE_NULL,													// const void*					pNext;
		VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT,			// VkCommandPoolCreateFlags		flags;
		queueFamilyIndex,											// deUint32						queueFamilyIndex;
	};
	const Unique<VkCommandPool>				cmdPool					(createCommandPool(vk, vkDevice, &cmdPoolParams));

	// Command buffer
	const VkCommandBufferAllocateInfo		cmdBufParams			=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO,				// VkStructureType				sType;
		DE_NULL,													// const void*					pNext;
		*cmdPool,													// VkCommandPool				pool;
		VK_COMMAND_BUFFER_LEVEL_PRIMARY,							// VkCommandBufferLevel			level;
		1u,															// uint32_t						bufferCount;
	};

	// Create command buffer
	const Unique<VkCommandBuffer>			primCmdBuf				(allocateCommandBuffer(vk, vkDevice, &cmdBufParams));

	const VkCommandBufferBeginInfo			primCmdBufBeginInfo		=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,				// sType
		DE_NULL,													// pNext
		0,															// flags
		DE_NULL														// const VkCommandBufferInheritanceInfo*	pInheritanceInfo;
	};

	// create event that will be used to check if command buffers has been executed
	const Unique<VkEvent>					event					(createEvent(vk, vkDevice));

	// reset event - at creation state is undefined
	VK_CHECK(vk.resetEvent(vkDevice, *event));

	// record command buffer
	VK_CHECK(vk.beginCommandBuffer(*primCmdBuf, &primCmdBufBeginInfo));
	{
		// allow execution of event during every stage of pipeline
		VkPipelineStageFlags stageMask = VK_PIPELINE_STAGE_ALL_COMMANDS_BIT;

		// record setting event
		vk.cmdSetEvent(*primCmdBuf, *event,stageMask);
	}
	VK_CHECK(vk.endCommandBuffer(*primCmdBuf));

	// create fence to wait for execution of queue
	const Unique<VkFence>					fence					(createFence(vk, vkDevice));

	// numSemaphores is declared const, so this array can be static
	// the semaphores will be destroyed automatically at end of scope
	Move <VkSemaphore>						semaphoreArray[numSemaphores];
	VkSemaphore								semaphores[numSemaphores];

	for (deUint32 idx = 0; idx < numSemaphores; ++idx) {
		// create semaphores for use in this test
		semaphoreArray[idx] = createSemaphore(vk, vkDevice);
		semaphores[idx] = semaphoreArray[idx].get();
	};

	{
		// create submit info for buffer - signal semaphores
		const VkSubmitInfo submitInfo1 =
		{
			VK_STRUCTURE_TYPE_SUBMIT_INFO,							// sType
			DE_NULL,												// pNext
			0u,														// waitSemaphoreCount
			DE_NULL,												// pWaitSemaphores
			DE_NULL,												// pWaitDstStageMask
			1,														// commandBufferCount
			&primCmdBuf.get(),										// pCommandBuffers
			numSemaphores,											// signalSemaphoreCount
			semaphores												// pSignalSemaphores
		};
		// Submit the command buffer to the queue
		VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo1, *fence));

		// wait for end of execution of queue
		VK_CHECK(vk.waitForFences(vkDevice, 1, &fence.get(), 0u, INFINITE_TIMEOUT));

		// check if buffer has been executed
		VkResult result = vk.getEventStatus(vkDevice,*event);
		if (result != VK_EVENT_SET)
			return tcu::TestStatus::fail("Submit Buffer and Wait for Many Semaphores Test FAILED");

		// reset event, so next buffers can set it again
		VK_CHECK(vk.resetEvent(vkDevice, *event));

		// reset fence, so it can be used again
		VK_CHECK(vk.resetFences(vkDevice, 1u, &fence.get()));
	}

	const deUint32							numberOfSemaphoresToBeWaitedByOneSubmission	= numSemaphores / numSubmissions;
	const std::vector<VkPipelineStageFlags>	waitDstStageFlags							(numberOfSemaphoresToBeWaitedByOneSubmission, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT);

	// the following code waits for the semaphores set above - numSubmissions queues will wait for each semaphore from above
	for (deUint32 idxSubmission = 0; idxSubmission < numSubmissions; ++idxSubmission) {

		// create submit info for buffer - waiting for semaphore
		const VkSubmitInfo				submitInfo2				=
		{
			VK_STRUCTURE_TYPE_SUBMIT_INFO,												// sType
			DE_NULL,																	// pNext
			numberOfSemaphoresToBeWaitedByOneSubmission,								// waitSemaphoreCount
			semaphores + (numberOfSemaphoresToBeWaitedByOneSubmission * idxSubmission),	// pWaitSemaphores
			waitDstStageFlags.data(),													// pWaitDstStageMask
			1,																			// commandBufferCount
			&primCmdBuf.get(),															// pCommandBuffers
			0u,																			// signalSemaphoreCount
			DE_NULL,																	// pSignalSemaphores
		};

		// Submit the second command buffer to the queue
		VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo2, *fence));

		// wait for 1 second.
		VK_CHECK(vk.waitForFences(vkDevice, 1, &fence.get(), 0u, 1000 * 1000 * 1000));

		// check if second buffer has been executed
		// if it has been executed, it means that the semaphore was signalled - so test if passed
		VkResult result = vk.getEventStatus(vkDevice,*event);
		if (result != VK_EVENT_SET)
			return tcu::TestStatus::fail("Submit Buffer and Wait for Many Semaphores Test FAILED");

		// reset fence, so it can be used again
		VK_CHECK(vk.resetFences(vkDevice, 1u, &fence.get()));

		// reset event, so next buffers can set it again
		VK_CHECK(vk.resetEvent(vkDevice, *event));
	}

	return tcu::TestStatus::pass("Submit Buffer and Wait for Many Semaphores Test succeeded");
}